

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O2

void kiss_fft_stride(kiss_fft_cfg st,kiss_fft_cpx *fin,kiss_fft_cpx *fout,int in_stride)

{
  kiss_fft_cpx *Fout;
  
  if (fin != fout) {
    kf_work(fout,fin,1,in_stride,st->factors,st);
    return;
  }
  Fout = (kiss_fft_cpx *)malloc((long)st->nfft << 3);
  kf_work(Fout,fin,1,in_stride,st->factors,st);
  memcpy(fout,Fout,(long)st->nfft << 3);
  free(Fout);
  return;
}

Assistant:

void kiss_fft_stride(kiss_fft_cfg st,const kiss_fft_cpx *fin,kiss_fft_cpx *fout,int in_stride)
{
    if (fin == fout) {
        //NOTE: this is not really an in-place FFT algorithm.
        //It just performs an out-of-place FFT into a temp buffer
        kiss_fft_cpx * tmpbuf = (kiss_fft_cpx*)KISS_FFT_TMP_ALLOC( sizeof(kiss_fft_cpx)*st->nfft);
        kf_work(tmpbuf,fin,1,in_stride, st->factors,st);
        memcpy(fout,tmpbuf,sizeof(kiss_fft_cpx)*st->nfft);
        KISS_FFT_TMP_FREE(tmpbuf);
    }else{
        kf_work( fout, fin, 1,in_stride, st->factors,st );
    }
}